

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool DivisionCornerCaseHelper<char,_unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (unsigned_short lhs,
               SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  uint *i;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1a;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_19;
  uint local_18;
  uint local_14;
  
  if (rhs.m_int < '\x01') {
    if (rhs.m_int == '\0') {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    local_18 = -((uint)lhs / (-(int)rhs.m_int & 0xffffU));
    i = &local_18;
    this = &local_1a;
  }
  else {
    local_14 = (uint)lhs / (uint)(byte)rhs.m_int;
    i = &local_14;
    this = &local_19;
  }
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>(this,(int *)i);
  result->m_int = this->m_int;
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }